

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void gimage::anon_unknown_17::loadTiledHeader
               (BasicImageIO *io,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *list,string *prefix,string *suffix,long *twidth,long *theight,long *tborder,
               long *width,long *height,int *depth)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  pointer pbVar4;
  istream *piVar5;
  int *piVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *in_RCX;
  string *in_RDX;
  set *in_RSI;
  long *in_RDI;
  long *in_R8;
  long *in_R9;
  long *in_stack_00000008;
  long *in_stack_00000010;
  long *in_stack_00000018;
  undefined4 *in_stack_00000020;
  istringstream in;
  char sep3;
  char sep2;
  char sep1;
  int k;
  int i;
  iterator it;
  int cols;
  int rows;
  exception *anon_var_0_1;
  exception *anon_var_0;
  Properties prop;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  istream *in_stack_fffffffffffffc58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  int local_300;
  int local_2fc;
  string local_2f8 [32];
  istringstream local_2d8 [336];
  char *in_stack_fffffffffffffe78;
  long *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  Properties *in_stack_fffffffffffffe90;
  char local_153;
  char local_152;
  char local_151;
  int local_150;
  int local_14c;
  _Self local_148;
  _Self local_140;
  int local_138;
  int local_134;
  _Base_ptr local_130;
  undefined1 local_121;
  string local_b8 [56];
  string local_80 [32];
  char local_60 [48];
  long *local_30;
  long *local_28;
  string *local_20;
  string *local_18;
  set *local_10;
  long *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x12fba4);
  *local_28 = 0;
  *local_30 = 0;
  *in_stack_00000008 = 0;
  *in_stack_00000010 = 0;
  *in_stack_00000018 = 0;
  *in_stack_00000020 = 0;
  gutil::Properties::Properties((Properties *)0x12fc0a);
  std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  std::__cxx11::string::c_str();
  gutil::Properties::load(local_60);
  std::__cxx11::string::~string(local_80);
  std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  std::__cxx11::string::c_str();
  gutil::Properties::load(local_60);
  std::__cxx11::string::~string(local_b8);
  gutil::Properties::getValue<long>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  gutil::getFileList(local_10,local_18,local_20);
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x12fde1);
  if (bVar1) {
    local_121 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::operator+(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    std::operator+(in_stack_fffffffffffffc28,(char)((ulong)in_stack_fffffffffffffc20 >> 0x38));
    std::operator+(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    gutil::IOException::IOException
              ((IOException *)in_stack_fffffffffffffc60,(string *)in_stack_fffffffffffffc58);
    local_121 = 0;
    __cxa_throw(uVar3,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_130 = (_Base_ptr)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(in_stack_fffffffffffffc18);
  std::
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffc20);
  uVar3 = std::__cxx11::string::c_str();
  (**(code **)(*local_8 + 0x20))(local_8,uVar3,local_28,local_30,in_stack_00000020);
  local_134 = 0;
  local_138 = 0;
  local_140._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffc18);
  while( true ) {
    local_148._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffffc18);
    bVar1 = std::operator!=(&local_140,&local_148);
    if (!bVar1) break;
    in_stack_fffffffffffffc60 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140;
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x12fffd);
    std::__cxx11::string::size();
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x13001e);
    in_stack_fffffffffffffc68 = (char *)std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_2f8,(ulong)pbVar4);
    std::__cxx11::istringstream::istringstream(local_2d8,local_2f8,_S_in);
    std::__cxx11::string::~string(local_2f8);
    in_stack_fffffffffffffc58 = std::operator>>((istream *)local_2d8,&local_151);
    piVar5 = (istream *)std::istream::operator>>(in_stack_fffffffffffffc58,&local_150);
    piVar5 = std::operator>>(piVar5,&local_152);
    piVar5 = (istream *)std::istream::operator>>(piVar5,&local_14c);
    std::operator>>(piVar5,&local_153);
    bVar2 = std::ios::good();
    if (((((bVar2 & 1) != 0) && (local_151 == '_')) && (local_152 == '_')) && (local_153 == '_')) {
      local_2fc = local_14c + 1;
      piVar6 = std::max<int>(&local_138,&local_2fc);
      local_138 = *piVar6;
      local_300 = local_150 + 1;
      in_stack_fffffffffffffc28 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::max<int>(&local_134,&local_300);
      local_134 = *(int *)in_stack_fffffffffffffc28;
    }
    std::__cxx11::istringstream::~istringstream(local_2d8);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffc20);
  }
  if ((local_138 != 0) && (local_134 != 0)) {
    *in_stack_00000010 = (*local_28 + *in_stack_00000008 * -2) * (long)local_138;
    *in_stack_00000018 = (*local_30 + *in_stack_00000008 * -2) * (long)local_134;
    gutil::Properties::~Properties((Properties *)0x130423);
    return;
  }
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x28);
  std::operator+(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  std::operator+(in_stack_fffffffffffffc28,(char)((ulong)__rhs >> 0x38));
  std::operator+(in_stack_fffffffffffffc28,__rhs);
  gutil::IOException::IOException
            ((IOException *)in_stack_fffffffffffffc60,(string *)in_stack_fffffffffffffc58);
  __cxa_throw(__rhs,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void loadTiledHeader(const BasicImageIO &io, std::set<std::string> &list,
                     const std::string &prefix, const std::string &suffix, long &twidth, long &theight,
                     long &tborder, long &width, long &height, int &depth)
{
  // initialise return parameters

  list.clear();
  twidth=0;
  theight=0;
  tborder=0;
  width=0;
  height=0;
  depth=0;

  // get optional border size

  gutil::Properties prop;

  try
  {
    prop.load((prefix+".hdr").c_str());
  }
  catch (const std::exception &)
  { }

  try
  {
    prop.load((prefix+"_param.txt").c_str());
  }
  catch (const std::exception &)
  { }

  prop.getValue("border", tborder, "0");

  // get list of all tiles

  gutil::getFileList(list, prefix, suffix);

  if (list.empty())
  {
    throw gutil::IOException("There are no tiles: "+prefix+':'+suffix);
  }

  // load header information of first tile

  io.loadHeader((*list.begin()).c_str(), twidth, theight, depth);

  // determine number of rows and columns

  int rows=0;
  int cols=0;

  for (std::set<std::string>::iterator it=list.begin(); it!=list.end(); ++it)
  {
    int i, k;
    char sep1, sep2, sep3;
    std::istringstream in(it->substr(prefix.size(), it->size()-prefix.size()-suffix.size()));

    in >> sep1 >> k >> sep2 >> i >> sep3;

    if (in.good() && sep1 == '_' && sep2 == '_' && sep3 == '_')
    {
      cols=std::max(cols, i+1);
      rows=std::max(rows, k+1);
    }
  }

  if (cols == 0 || rows == 0)
  {
    throw gutil::IOException("This is not a tiled image: "+prefix+':'+suffix);
  }

  // compute total size

  width=(twidth-2*tborder)*cols;
  height=(theight-2*tborder)*rows;
}